

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O1

void __thiscall QBitArray::resize(QBitArray *this,qsizetype size)

{
  byte *pbVar1;
  Data *pDVar2;
  char *pcVar3;
  quint8 *c;
  
  if (0 < size) {
    QByteArray::resize(&this->d,(size + 7U >> 3) + 1,'\0');
    pDVar2 = (this->d).d.d;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (__int_type_conflict)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>))
    {
      QByteArray::reallocData(&this->d,(this->d).d.size,KeepSize);
    }
    pcVar3 = (this->d).d.ptr;
    *pcVar3 = (char)((int)(this->d).d.size << 3) - (char)size;
    if ((size & 7U) != 0) {
      pbVar1 = (byte *)(pcVar3 + ((ulong)size >> 3) + 1);
      *pbVar1 = *pbVar1 & ~(-1 << (sbyte)(size & 7U));
    }
    return;
  }
  QByteArray::resize(&this->d,0);
  return;
}

Assistant:

void QBitArray::resize(qsizetype size)
{
    Q_ASSERT_X(size >= 0, "QBitArray::resize", "Size must be greater than or equal to 0.");
    if (size <= 0) {
        d.resize(0);
    } else {
        d.resize(allocation_size(size), 0x00);
        adjust_head_and_tail(d.data(), d.size(), size);
    }
}